

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

lzma_match *
hc_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  lzma_match *plVar1;
  ulong uVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *puVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  lzma_match *local_40;
  
  son[cyclic_pos] = cur_match;
  do {
    bVar10 = false;
    bVar9 = depth != 0;
    depth = depth - 1;
    plVar1 = matches;
    if ((bVar9) && (uVar8 = pos - cur_match, plVar1 = matches, uVar8 < cyclic_size)) {
      puVar7 = cur + -(ulong)uVar8;
      uVar3 = 0;
      if (cyclic_pos < uVar8) {
        uVar3 = cyclic_size;
      }
      cur_match = son[(cyclic_pos - uVar8) + uVar3];
      plVar1 = local_40;
      if ((puVar7[len_best] == cur[len_best]) && (*puVar7 == *cur)) {
        uVar4 = 1;
        uVar5 = 0;
        do {
          uVar6 = (uint)uVar4;
          uVar3 = len_limit;
          if (uVar4 - (len_limit - 1) == 1) break;
          uVar2 = uVar4 & 0xffffffff;
          uVar4 = uVar4 + 1;
          uVar5 = uVar5 + 1;
          uVar6 = uVar5;
          uVar3 = uVar5;
        } while (puVar7[uVar2] == cur[uVar2]);
        bVar10 = uVar6 != len_limit;
        if (len_best < uVar3) {
          matches->len = uVar3;
          matches->dist = uVar8 - 1;
          matches = matches + 1;
          len_best = uVar3;
          if (uVar6 == len_limit) {
            plVar1 = matches;
          }
        }
        else {
          bVar10 = true;
        }
      }
      else {
        bVar10 = true;
      }
    }
    local_40 = plVar1;
    if (!bVar10) {
      return local_40;
    }
  } while( true );
}

Assistant:

static lzma_match *
hc_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	son[cyclic_pos] = cur_match;

	while (true) {
		const uint32_t delta = pos - cur_match;
		const uint8_t *pb;
		if (depth-- == 0 || delta >= cyclic_size)
			return matches;

		pb = cur - delta;
		cur_match = son[cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0)];

		if (pb[len_best] == cur[len_best] && pb[0] == cur[0]) {
			uint32_t len = 0;
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit)
					return matches;
			}
		}
	}
}